

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panning.cpp
# Opt level: O2

unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_>
anon_unknown.dwarf_1ee2ad::CreateStablizer(size_t outchans,ALuint srate)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined4 in_register_00000034;
  
  FrontStablizer::Create((FrontStablizer *)outchans,CONCAT44(in_register_00000034,srate));
  lVar1 = *(long *)outchans;
  lVar2 = *(long *)(lVar1 + 0x6010);
  for (lVar3 = lVar1 + 0x6020; lVar3 != lVar2 * 0x400 + lVar1 + 0x6020; lVar3 = lVar3 + 0x400) {
    for (lVar4 = 0; lVar4 != 0x400; lVar4 = lVar4 + 4) {
      *(undefined4 *)(lVar3 + lVar4) = 0;
    }
  }
  BandSplitterR<float>::init
            ((BandSplitterR<float> *)(lVar1 + 0x4000),
             (EVP_PKEY_CTX *)CONCAT44(in_register_00000034,srate));
  return (__uniq_ptr_data<FrontStablizer,_std::default_delete<FrontStablizer>,_true,_true>)
         (__uniq_ptr_data<FrontStablizer,_std::default_delete<FrontStablizer>,_true,_true>)outchans;
}

Assistant:

std::unique_ptr<FrontStablizer> CreateStablizer(const size_t outchans, const ALuint srate)
{
    auto stablizer = FrontStablizer::Create(outchans);
    for(auto &buf : stablizer->DelayBuf)
        std::fill(buf.begin(), buf.end(), 0.0f);

    /* Initialize band-splitting filter for the mid signal, with a crossover at
     * 5khz (could be higher).
     */
    stablizer->MidFilter.init(5000.0f / static_cast<float>(srate));

    return stablizer;
}